

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void fill_circle(chunk *c,wchar_t y0,wchar_t x0,wchar_t radius,wchar_t border,wchar_t feat,
                wchar_t flag,_Bool light)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  
  if (L'\xffffffff' < radius) {
    uVar10 = 0;
    wVar7 = radius;
    wVar6 = L'\0';
    wVar5 = L'\0';
    do {
      wVar4 = wVar7;
      iVar9 = (uint)(wVar4 < wVar6) + border;
      if (border == L'\0') {
        iVar9 = 0;
      }
      wVar7 = x0 - (iVar9 + wVar4);
      wVar6 = wVar4 + x0 + iVar9;
      fill_xrange(c,y0 - wVar5,wVar7,wVar6,feat,flag,light);
      fill_xrange(c,wVar5 + y0,wVar7,wVar6,feat,flag,light);
      wVar6 = y0 - (iVar9 + wVar4);
      wVar7 = iVar9 + wVar4 + y0;
      fill_yrange(c,x0 - wVar5,wVar6,wVar7,feat,flag,light);
      fill_yrange(c,wVar5 + x0,wVar6,wVar7,feat,flag,light);
      wVar7 = wVar4;
      if (wVar5 < radius) {
        iVar8 = wVar4 * 2 + -1;
        iVar9 = wVar4 + L'\x01';
        uVar1 = uVar10 + ~(wVar5 * 2);
        do {
          uVar10 = uVar1;
          uVar1 = iVar8 + uVar10;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar3 = -uVar10;
          if (0 < (int)uVar10) {
            uVar3 = uVar10;
          }
          iVar8 = iVar8 + -2;
          iVar9 = iVar9 + -1;
        } while (uVar2 < uVar3);
        wVar7 = iVar9 - (uint)(uVar2 < uVar3);
      }
      bVar11 = wVar5 != radius;
      wVar6 = wVar4;
      wVar5 = wVar5 + L'\x01';
    } while (bVar11);
  }
  return;
}

Assistant:

void fill_circle(struct chunk *c, int y0, int x0, int radius, int border,
				 int feat, int flag, bool light)
{
	int i, last = 0;
	/* r2i2k2 is radius * radius - i * i - k * k. */
	int k, r2i2k2;
	for(i = 0, k = radius, r2i2k2 = 0; i <= radius; i++) {
		int b = border;
		if (border && last > k) b++;
		
		fill_xrange(c, y0 - i, x0 - k - b, x0 + k + b, feat, flag, light);
		fill_xrange(c, y0 + i, x0 - k - b, x0 + k + b, feat, flag, light);
		fill_yrange(c, x0 - i, y0 - k - b, y0 + k + b, feat, flag, light);
		fill_yrange(c, x0 + i, y0 - k - b, y0 + k + b, feat, flag, light);
		last = k;

		/* Update r2i2k2 and k for next i. */
		if (i < radius) {
			r2i2k2 -= 2 * i + 1;
			while (1) {
				/*
				 * The change to r2i2k2 if k is decreased by
				 * one.
				 */
				int adj = 2 * k - 1;

				if (abs(r2i2k2 + adj) >= abs(r2i2k2)) {
					break;
				}
				--k;
				r2i2k2 += adj;
			}
		}
	}
}